

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_value_function.cpp
# Opt level: O2

void __thiscall
duckdb::WindowValueLocalState::Finalize
          (WindowValueLocalState *this,WindowExecutorGlobalState *gstate,CollectionPtr collection)

{
  pointer __p;
  WindowMergeSortTreeLocalState *this_00;
  WindowCollection *args;
  optional_ptr<duckdb::WindowCollection,_true> local_20;
  pointer local_18;
  
  local_20.ptr = collection.ptr;
  WindowExecutorLocalState::Finalize((WindowExecutorLocalState *)this,gstate,collection);
  if ((this->local_value).
      super_unique_ptr<duckdb::WindowAggregatorState,_std::default_delete<duckdb::WindowAggregatorState>_>
      ._M_t.
      super___uniq_ptr_impl<duckdb::WindowAggregatorState,_std::default_delete<duckdb::WindowAggregatorState>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::WindowAggregatorState_*,_std::default_delete<duckdb::WindowAggregatorState>_>
      .super__Head_base<0UL,_duckdb::WindowAggregatorState_*,_false>._M_head_impl !=
      (WindowAggregatorState *)0x0) {
    this_00 = (WindowMergeSortTreeLocalState *)
              unique_ptr<duckdb::WindowAggregatorState,_std::default_delete<duckdb::WindowAggregatorState>,_true>
              ::operator->(&this->local_value);
    WindowMergeSortTreeLocalState::Sort(this_00);
    WindowMergeSortTree::Build
              ((WindowMergeSortTree *)
               this_00[1].super_WindowAggregatorState._vptr_WindowAggregatorState);
  }
  if (((this->cursor).
       super_unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>_>._M_t.
       super___uniq_ptr_impl<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::WindowCursor_*,_std::default_delete<duckdb::WindowCursor>_>.
       super__Head_base<0UL,_duckdb::WindowCursor_*,_false>._M_head_impl == (WindowCursor *)0x0) &&
     (this->gvstate->child_idx != 0xffffffffffffffff)) {
    args = optional_ptr<duckdb::WindowCollection,_true>::operator*(&local_20);
    make_uniq<duckdb::WindowCursor,duckdb::WindowCollection&,unsigned_long_const&>
              ((duckdb *)&local_18,args,&this->gvstate->child_idx);
    __p = local_18;
    local_18 = (pointer)0x0;
    ::std::__uniq_ptr_impl<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>_>::reset
              ((__uniq_ptr_impl<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>_> *)
               &this->cursor,__p);
    ::std::unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>_>::~unique_ptr
              ((unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>_> *)
               &local_18);
  }
  return;
}

Assistant:

void WindowValueLocalState::Finalize(WindowExecutorGlobalState &gstate, CollectionPtr collection) {
	WindowExecutorBoundsState::Finalize(gstate, collection);

	if (local_value) {
		auto &value_state = local_value->Cast<WindowIndexTreeLocalState>();
		value_state.Sort();
		value_state.index_tree.Build();
	}

	// Prepare to scan
	if (!cursor && gvstate.child_idx != DConstants::INVALID_INDEX) {
		cursor = make_uniq<WindowCursor>(*collection, gvstate.child_idx);
	}
}